

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoprintf.h
# Opt level: O0

int npf_utoa_rev(npf_uint_t val,char *buf,uint_fast8_t base,char case_adj)

{
  char cVar1;
  char cVar2;
  byte local_1b;
  int_fast8_t d;
  uint_fast8_t n;
  char case_adj_local;
  char *pcStack_18;
  uint_fast8_t base_local;
  char *buf_local;
  npf_uint_t val_local;
  
  local_1b = 0;
  pcStack_18 = buf;
  buf_local = (char *)val;
  do {
    cVar1 = (char)((ulong)buf_local % (ulong)base);
    if (cVar1 < '\n') {
      cVar2 = '0';
    }
    else {
      cVar2 = case_adj + '7';
    }
    *pcStack_18 = cVar2 + cVar1;
    local_1b = local_1b + 1;
    buf_local = (char *)((ulong)buf_local / (ulong)base);
    pcStack_18 = pcStack_18 + 1;
  } while (buf_local != (char *)0x0);
  return (int)local_1b;
}

Assistant:

static NPF_NOINLINE int npf_utoa_rev(
    npf_uint_t val, char *buf, uint_fast8_t base, char case_adj) {
  uint_fast8_t n = 0;
  do {
    int_fast8_t const d = (int_fast8_t)(val % base);
    *buf++ = (char)(((d < 10) ? '0' : ('A' - 10 + case_adj)) + d);
    ++n;
    val /= base;
  } while (val);
  return (int)n;
}